

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_draw_text<unsigned_char,unsigned_char,unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,char *text,uchar *foreground_color,
          uchar *background_color,float opacity,CImgList<unsigned_char> *font,bool is_native_font)

{
  uchar value;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  CImg<unsigned_char> *pCVar7;
  CImgArgumentException *this_00;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  uchar *puVar11;
  uint local_110;
  uint local_c4;
  uint c_3;
  uint local_a0;
  uint local_9c;
  uint c_2;
  uint cmin;
  CImg<unsigned_char> letter;
  int iStack_70;
  uchar c_1;
  uint i_1;
  int y;
  int x;
  uint i;
  int iStack_5c;
  uchar c;
  int w;
  int y_1;
  int x_1;
  bool _is_empty;
  uint text_length;
  bool is_native_font_local;
  float opacity_local;
  uchar *background_color_local;
  uchar *foreground_color_local;
  char *text_local;
  int y0_local;
  int x0_local;
  CImg<unsigned_char> *this_local;
  
  if (text != (char *)0x0) {
    pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)font);
    if (pCVar7 == (CImg<unsigned_char> *)0x0) {
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
      uVar5 = this->_width;
      uVar1 = this->_height;
      uVar2 = this->_depth;
      uVar3 = this->_spectrum;
      puVar11 = this->_data;
      pcVar8 = "non-";
      if ((this->_is_shared & 1U) != 0) {
        pcVar8 = "";
      }
      pcVar9 = pixel_type();
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_text(): Empty specified font.",
                 (ulong)uVar5,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,puVar11,pcVar8,pcVar9);
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                  CImgArgumentException::~CImgArgumentException);
    }
    sVar10 = strlen(text);
    bVar4 = is_empty(this);
    if (bVar4) {
      w = 0;
      iStack_5c = 0;
      i = 0;
      x._3_1_ = 0;
      for (y = 0; (uint)y < (uint)sVar10; y = y + 1) {
        x._3_1_ = text[(uint)y];
        if (x._3_1_ == 9) {
          pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)font);
          w = pCVar7[0x20]._width * 4 + w;
        }
        else if (x._3_1_ == 10) {
          pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)font);
          iStack_5c = pCVar7->_height + iStack_5c;
          if ((int)i < w) {
            i = w;
          }
          w = 0;
        }
        else if ((uint)x._3_1_ < font->_width) {
          pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)font);
          w = pCVar7[x._3_1_]._width + w;
        }
      }
      if ((w != 0) || (x._3_1_ == 10)) {
        if ((int)i < w) {
          i = w;
        }
        pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)font);
        iStack_5c = pCVar7->_height + iStack_5c;
      }
      if (is_native_font) {
        local_110 = 1;
      }
      else {
        pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)font);
        local_110 = pCVar7->_spectrum;
      }
      assign(this,x0 + i,y0 + iStack_5c,1,local_110,'\0');
    }
    iStack_70 = y0;
    i_1 = x0;
    for (letter._data._4_4_ = 0; letter._data._4_4_ < (uint)sVar10;
        letter._data._4_4_ = letter._data._4_4_ + 1) {
      letter._data._3_1_ = text[letter._data._4_4_];
      if (letter._data._3_1_ == 9) {
        pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)font);
        i_1 = pCVar7[0x20]._width * 4 + i_1;
      }
      else if (letter._data._3_1_ == 10) {
        pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)font);
        iStack_70 = pCVar7->_height + iStack_70;
        i_1 = x0;
      }
      else if ((uint)letter._data._3_1_ < font->_width) {
        pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)font);
        CImg((CImg<unsigned_char> *)&c_2,pCVar7 + letter._data._3_1_);
        puVar11 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&c_2);
        if (puVar11 != (uchar *)0x0) {
          if ((is_native_font) && (letter._height < this->_spectrum)) {
            resize((CImg<unsigned_char> *)&c_2,-100,-100,1,this->_spectrum,0,2,0.0,0.0,0.0,0.0);
          }
          local_9c = cimg::min<unsigned_int,unsigned_int>(&this->_spectrum,&letter._height);
          if (foreground_color != (uchar *)0x0) {
            for (local_a0 = 0; local_a0 < local_9c; local_a0 = local_a0 + 1) {
              if (foreground_color[local_a0] != '\x01') {
                value = foreground_color[local_a0];
                get_shared_channel((CImg<unsigned_char> *)&stack0xffffffffffffff40,
                                   (CImg<unsigned_char> *)&c_2,local_a0);
                operator*=((CImg<unsigned_char> *)&stack0xffffffffffffff40,value);
                ~CImg((CImg<unsigned_char> *)&stack0xffffffffffffff40);
              }
            }
          }
          uVar5 = (uint)letter._data._3_1_;
          iVar6 = CImgList<unsigned_char>::width(font);
          if ((int)(uVar5 | 0x100) < iVar6) {
            if (background_color != (uchar *)0x0) {
              for (local_c4 = 0; local_c4 < local_9c; local_c4 = local_c4 + 1) {
                draw_rectangle(this,i_1,iStack_70,0,local_c4,(i_1 - 1) + c_2,iStack_70 + -1 + cmin,0
                               ,local_c4,background_color[local_c4],opacity);
              }
            }
            pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)font);
            draw_image<unsigned_char,unsigned_char>
                      (this,i_1,iStack_70,(CImg<unsigned_char> *)&c_2,
                       pCVar7 + (ulong)letter._data._3_1_ + 0x100,opacity,255.0);
          }
          else {
            draw_image<unsigned_char>(this,i_1,iStack_70,(CImg<unsigned_char> *)&c_2,opacity);
          }
          i_1 = c_2 + i_1;
        }
        ~CImg((CImg<unsigned_char> *)&c_2);
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& _draw_text(const int x0, const int y0,
                        const char *const text,
                        const tc1 *const foreground_color, const tc2 *const background_color,
                        const float opacity, const CImgList<t>& font,
                        const bool is_native_font) {
      if (!text) return *this;
      if (!font)
        throw CImgArgumentException(_cimg_instance
                                    "draw_text(): Empty specified font.",
                                    cimg_instance);

      const unsigned int text_length = (unsigned int)std::strlen(text);
      const bool _is_empty = is_empty();
      if (_is_empty) {
        // If needed, pre-compute necessary size of the image
        int x = 0, y = 0, w = 0;
        unsigned char c = 0;
        for (unsigned int i = 0; i<text_length; ++i) {
          c = text[i];
          switch (c) {
          case '\n' : y+=font[0]._height; if (x>w) w = x; x = 0; break;
          case '\t' : x+=4*font[' ']._width; break;
          default : if (c<font._width) x+=font[c]._width;
          }
        }
        if (x!=0 || c=='\n') {
          if (x>w) w=x;
          y+=font[0]._height;
        }
        assign(x0+w,y0+y,1,is_native_font?1:font[0]._spectrum,0);
      }

      int x = x0, y = y0;
      for (unsigned int i = 0; i<text_length; ++i) {
        const unsigned char c = text[i];
        switch (c) {
        case '\n' : y+=font[0]._height; x = x0; break;
        case '\t' : x+=4*font[' ']._width; break;
        default : if (c<font._width) {
            CImg<T> letter = font[c];
            if (letter) {
              if (is_native_font && _spectrum>letter._spectrum) letter.resize(-100,-100,1,_spectrum,0,2);
              const unsigned int cmin = cimg::min(_spectrum,letter._spectrum);
              if (foreground_color) for (unsigned int c = 0; c<cmin; ++c) if (foreground_color[c]!=1) letter.get_shared_channel(c)*=foreground_color[c];
              if (c+256<font.width()) { // Letter has mask.
                if (background_color) for (unsigned int c = 0; c<cmin; ++c) draw_rectangle(x,y,0,c,x+letter._width-1,y+letter._height-1,0,c,background_color[c],opacity);
                draw_image(x,y,letter,font[c+256],opacity,(T)255);
              } else draw_image(x,y,letter,opacity); // Letter has no mask.
              x+=letter._width;
            }
          }
        }
      }
      return *this;
    }